

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

int32_t icu_63::spanOneBackUTF8(UnicodeSet *set,uint8_t *s,int32_t length)

{
  byte bVar1;
  UBool UVar2;
  UChar32 c;
  uint uVar3;
  uint uVar4;
  int32_t i;
  
  bVar1 = s[(long)length + -1];
  if ((char)bVar1 < '\0') {
    i = length + -1;
    c = utf8_prevCharSafeBody_63(s,0,&i,(uint)bVar1,-3);
    uVar4 = length - i;
    UVar2 = UnicodeSet::contains(set,c);
    uVar3 = -uVar4;
    if (UVar2 != '\0') {
      uVar3 = uVar4;
    }
  }
  else {
    UVar2 = UnicodeSet::contains(set,(uint)bVar1);
    uVar3 = -(uint)(UVar2 == '\0') | 1;
  }
  return uVar3;
}

Assistant:

static inline int32_t
spanOneBackUTF8(const UnicodeSet &set, const uint8_t *s, int32_t length) {
    UChar32 c=s[length-1];
    if(U8_IS_SINGLE(c)) {
        return set.contains(c) ? 1 : -1;
    }
    int32_t i=length-1;
    c=utf8_prevCharSafeBody(s, 0, &i, c, -3);
    length-=i;
    return set.contains(c) ? length : -length;
}